

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O3

Vec_Str_t * Gia_WriteEquivClasses(Gia_Man_t *p)

{
  undefined8 in_RAX;
  uchar *puVar1;
  Vec_Str_t *pVVar2;
  int nEquivSize;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  puVar1 = Gia_WriteEquivClassesInt(p,&local_14);
  pVVar2 = (Vec_Str_t *)malloc(0x10);
  pVVar2->nSize = local_14;
  pVVar2->nCap = local_14;
  pVVar2->pArray = (char *)puVar1;
  return pVVar2;
}

Assistant:

Vec_Str_t * Gia_WriteEquivClasses( Gia_Man_t * p )
{
    int nEquivSize;
    unsigned char * pBuffer = Gia_WriteEquivClassesInt( p, &nEquivSize );
    return Vec_StrAllocArray( (char *)pBuffer, nEquivSize );
}